

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void assert_solvers_result<double,std::less<double>>
               (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *cost_matrix,double expected_cost,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *expected_assignment,
               less<double> *cost_comparator)

{
  ostream *poVar1;
  _func_double_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr_less<double>_ptr
  *local_38;
  _func_double_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr_less<double>_ptr
  *local_30;
  less<double> *local_28;
  less<double> *cost_comparator_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *expected_assignment_local;
  double expected_cost_local;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *cost_matrix_local;
  
  local_28 = cost_comparator;
  cost_comparator_local = (less<double> *)expected_assignment;
  expected_assignment_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)expected_cost
  ;
  expected_cost_local = (double)cost_matrix;
  poVar1 = std::operator<<((ostream *)&std::cout,"  Testing Hungarian solver");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_30 = hungarian_algorithm::
             solve<double,unsigned_long,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<double>>
  ;
  assert_solver_result<double(*)(boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::less<double>const&),double,std::less<double>>
            (&local_30,
             (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)expected_cost_local,(double)expected_assignment_local,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)cost_comparator_local,local_28
            );
  poVar1 = std::operator<<((ostream *)&std::cout,"  Testing brute force solver");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_38 = hungarian_algorithm::
             solveBruteForce<double,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<double>>
  ;
  assert_solver_result<double(*)(boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::less<double>const&),double,std::less<double>>
            (&local_38,
             (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)expected_cost_local,(double)expected_assignment_local,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)cost_comparator_local,local_28
            );
  return;
}

Assistant:

void assert_solvers_result(const ublas::matrix<Cost>& cost_matrix, const Cost expected_cost,
                           const std::vector<std::size_t>& expected_assignment,
                           const CostComparator& cost_comparator)
{
  typedef Cost SolvingFunction(const ublas::matrix<Cost>&, const std::size_t, const std::size_t,
                               std::vector<std::size_t>&, const CostComparator&);
  std::cout << "  Testing Hungarian solver" << std::endl;
  assert_solver_result(static_cast<SolvingFunction*>(&hungarian_algorithm::solve), cost_matrix, expected_cost,
                       expected_assignment, cost_comparator);
  std::cout << "  Testing brute force solver" << std::endl;
  assert_solver_result(static_cast<SolvingFunction*>(&hungarian_algorithm::solveBruteForce), cost_matrix, expected_cost,
                       expected_assignment, cost_comparator);
}